

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml_print.hpp
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 rapidxml::internal::copy_and_expand_chars<std::back_insert_iterator<std::__cxx11::string>,char>
           (char *begin,char *end,char noexpand,
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           out)

{
  byte bVar1;
  char cVar2;
  
  if (begin != end) {
    do {
      bVar1 = *begin;
      cVar2 = (char)out.container;
      if (bVar1 != noexpand) {
        if (bVar1 < 0x27) {
          if (bVar1 == 0x22) {
            std::__cxx11::string::push_back(cVar2);
            std::__cxx11::string::push_back(cVar2);
          }
          else {
            if (bVar1 != 0x26) goto LAB_001159c5;
            std::__cxx11::string::push_back(cVar2);
          }
        }
        else if (bVar1 == 0x27) {
          std::__cxx11::string::push_back(cVar2);
          std::__cxx11::string::push_back(cVar2);
        }
        else if ((bVar1 != 0x3c) && (bVar1 != 0x3e)) goto LAB_001159c5;
        std::__cxx11::string::push_back(cVar2);
        std::__cxx11::string::push_back(cVar2);
        std::__cxx11::string::push_back(cVar2);
      }
LAB_001159c5:
      std::__cxx11::string::push_back(cVar2);
      begin = (char *)((byte *)begin + 1);
    } while (begin != end);
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

inline OutIt copy_and_expand_chars(const Ch *begin, const Ch *end, Ch noexpand, OutIt out)
        {
            while (begin != end)
            {
                if (*begin == noexpand)
                {
                    *out++ = *begin;    // No expansion, copy character
                }
                else
                {
                    switch (*begin)
                    {
                    case Ch('<'):
                        *out++ = Ch('&'); *out++ = Ch('l'); *out++ = Ch('t'); *out++ = Ch(';');
                        break;
                    case Ch('>'): 
                        *out++ = Ch('&'); *out++ = Ch('g'); *out++ = Ch('t'); *out++ = Ch(';');
                        break;
                    case Ch('\''): 
                        *out++ = Ch('&'); *out++ = Ch('a'); *out++ = Ch('p'); *out++ = Ch('o'); *out++ = Ch('s'); *out++ = Ch(';');
                        break;
                    case Ch('"'): 
                        *out++ = Ch('&'); *out++ = Ch('q'); *out++ = Ch('u'); *out++ = Ch('o'); *out++ = Ch('t'); *out++ = Ch(';');
                        break;
                    case Ch('&'): 
                        *out++ = Ch('&'); *out++ = Ch('a'); *out++ = Ch('m'); *out++ = Ch('p'); *out++ = Ch(';'); 
                        break;
                    default:
                        *out++ = *begin;    // No expansion, copy character
                    }
                }
                ++begin;    // Step to next character
            }
            return out;
        }